

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O1

void saveFaces(Mat *img,Mat *img_gray)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  string saveName;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  Rect roi;
  stringstream buffer;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_2e0;
  _InputArray local_2c8;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  void *local_298;
  undefined8 uStack_290;
  long local_288;
  Mat *local_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  Mat local_218 [96];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_280 = img;
  cv::Mat::Mat(local_218,img_gray);
  detectFaces(&local_2e0,local_218);
  cv::Mat::~Mat(local_218);
  if (local_2e0.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_2e0.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0xc;
    uVar4 = 0;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0x106119);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_268 = *plVar2;
        lStack_260 = plVar1[3];
        local_278 = &local_268;
      }
      else {
        local_268 = *plVar2;
        local_278 = (long *)*plVar1;
      }
      local_270 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_300 = &local_2f0;
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_2f0 = *plVar2;
        lStack_2e8 = plVar1[3];
      }
      else {
        local_2f0 = *plVar2;
        local_300 = (long *)*plVar1;
      }
      local_2f8 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((Size *)CONCAT44(local_2c8._4_4_,local_2c8.flags) != &local_2c8.sz) {
        operator_delete((undefined1 *)CONCAT44(local_2c8._4_4_,local_2c8.flags),
                        (long)local_2c8.sz + 1);
      }
      local_2a8 = *(undefined4 *)
                   ((long)local_2e0.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar3 + -0xc);
      local_2a4 = *(undefined4 *)
                   ((long)local_2e0.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar3 + -8);
      local_2a0 = *(undefined4 *)
                   ((long)local_2e0.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar3 + -4);
      local_29c = *(undefined4 *)
                   ((long)&(local_2e0.
                            super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start)->x + lVar3);
      cv::Mat::Mat((Mat *)&local_278,local_280,(Rect_ *)&local_2a8);
      local_2c8.sz.width = 0;
      local_2c8.sz.height = 0;
      local_2c8.flags = 0x1010000;
      local_288 = 0;
      local_298 = (void *)0x0;
      uStack_290 = 0;
      local_2c8.obj = (Mat *)&local_278;
      cv::imwrite((string *)&local_300,&local_2c8,(vector *)&local_298);
      if (local_298 != (void *)0x0) {
        operator_delete(local_298,local_288 - (long)local_298);
      }
      cv::Mat::~Mat((Mat *)&local_278);
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)local_2e0.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2e0.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_2e0.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void saveFaces(Mat img, Mat img_gray) {
  vector<Rect> faces = detectFaces(img_gray);
  for (size_t i = 0; i < faces.size(); i++) {
    stringstream buffer;
    buffer << i;
    string saveName = "smile" + buffer.str() + ".png";
    Rect roi = faces[i];
    imwrite(saveName, img(roi));
  }
}